

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_short,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> SVar3;
  byte local_3b;
  undefined8 uStack_3a;
  u8 i;
  SR result;
  Simd<unsigned_short,_(unsigned_char)__b_> lhs;
  unsigned_short amount;
  BinopFunc<unsigned_short,_unsigned_short> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_short>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  result.v[4] = SVar3.v[0];
  result.v[5] = SVar3.v[1];
  result.v[6] = SVar3.v[2];
  result.v[7] = SVar3.v[3];
  lhs.v[0] = SVar3.v[4];
  lhs.v[1] = SVar3.v[5];
  lhs.v[2] = SVar3.v[6];
  lhs.v[3] = SVar3.v[7];
  for (local_3b = 0; local_3b < 8; local_3b = local_3b + 1) {
    uVar2 = (*f)(result.v[(ulong)local_3b + 4],uVar1);
    lhs.v[(ulong)local_3b - 0xc] = uVar2;
  }
  SVar3.v[4] = result.v[0];
  SVar3.v[5] = result.v[1];
  SVar3.v[6] = result.v[2];
  SVar3.v[7] = result.v[3];
  SVar3.v._0_8_ = uStack_3a;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}